

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O3

SharedDispatcher __thiscall
AmsConnection::DispatcherListAdd(AmsConnection *this,VirtualConnection *connection)

{
  uint16_t *__mutex;
  _Base_ptr p_Var1;
  int iVar2;
  pair<unsigned_short,_AmsAddr> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  SharedDispatcher SVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_short,_AmsAddr>,_std::shared_ptr<NotificationDispatcher>_>_>,_bool>
  pVar5;
  SharedDispatcher dispatcher;
  undefined1 local_69;
  shared_ptr<NotificationDispatcher> local_68;
  undefined1 local_58 [16];
  _Bind<long_(AmsConnection::*(AmsConnection_*,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short))(const_AmsAddr_&,_unsigned_int,_unsigned_int,_unsigned_short)>
  local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  SVar4 = DispatcherListGet((AmsConnection *)local_58,connection);
  _Var3 = SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if ((Router *)local_58._0_8_ == (Router *)0x0) {
    __mutex = &connection[0x5b0].second.port;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    local_48._M_f = (offset_in_AmsConnection_to_subr)DeleteNotification;
    local_48._8_1_ = '\0';
    local_48._9_1_ = '\0';
    local_48._10_1_ = '\0';
    local_48._11_1_ = '\0';
    local_48._12_1_ = '\0';
    local_48._13_1_ = '\0';
    local_48._14_1_ = '\0';
    local_48._15_1_ = '\0';
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_AmsConnection_*,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short>
    .super__Tuple_impl<1UL,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short>.
    super__Tuple_impl<2UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short>.
    super__Tuple_impl<3UL,_std::_Placeholder<2>,_unsigned_short>.
    super__Tuple_impl<4UL,_unsigned_short>.super__Head_base<4UL,_unsigned_short,_false>._M_head_impl
         = (_Tuple_impl<3UL,_std::_Placeholder<2>,_unsigned_short>)in_RDX->first;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_AmsConnection_*,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short>
    .super__Tuple_impl<1UL,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short>.
    super__Head_base<1UL,_AmsAddr,_false>._M_head_impl = in_RDX->second;
    local_68.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_AmsConnection_*,_AmsAddr,_std::_Placeholder<1>,_std::_Placeholder<2>,_unsigned_short>
    .super__Head_base<0UL,_AmsConnection_*,_false>._M_head_impl = (AmsConnection *)connection;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<NotificationDispatcher,std::allocator<NotificationDispatcher>,std::_Bind<long(AmsConnection::*(AmsConnection*,AmsAddr,std::_Placeholder<1>,std::_Placeholder<2>,unsigned_short))(AmsAddr_const&,unsigned_int,unsigned_int,unsigned_short)>>
              (&local_68.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(NotificationDispatcher **)&local_68,
               (allocator<NotificationDispatcher> *)&local_69,&local_48);
    pVar5 = std::
            _Rb_tree<std::pair<unsigned_short,AmsAddr>,std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<unsigned_short,AmsAddr>>,std::allocator<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>>
            ::
            _M_emplace_unique<std::pair<unsigned_short,AmsAddr>const&,std::shared_ptr<NotificationDispatcher>>
                      ((_Rb_tree<std::pair<unsigned_short,AmsAddr>,std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<unsigned_short,AmsAddr>>,std::allocator<std::pair<std::pair<unsigned_short,AmsAddr>const,std::shared_ptr<NotificationDispatcher>>>>
                        *)(connection + 0x5ac),in_RDX,&local_68);
    this->router = (Router *)pVar5.first._M_node._M_node[1]._M_left;
    p_Var1 = pVar5.first._M_node._M_node[1]._M_right;
    *(_Base_ptr *)&(this->socket).super_Socket = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
    if (local_68.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    this->router = (Router *)local_58._0_8_;
    (this->socket).super_Socket.m_WSAInitialized = local_58._8_4_;
    (this->socket).super_Socket.m_Socket = local_58._12_4_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_58._8_8_ + 8) = *(_Atomic_word *)(local_58._8_8_ + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var3._M_pi = extraout_RDX_00;
  }
  SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedDispatcher)
         SVar4.super___shared_ptr<NotificationDispatcher,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedDispatcher AmsConnection::DispatcherListAdd(const VirtualConnection& connection)
{
    const auto dispatcher = DispatcherListGet(connection);
    if (dispatcher) {
        return dispatcher;
    }
    std::lock_guard<std::recursive_mutex> lock(dispatcherListMutex);
    return dispatcherList.emplace(connection,
                                  std::make_shared<NotificationDispatcher>(std::bind(&AmsConnection::DeleteNotification,
                                                                                     this,
                                                                                     connection.second,
                                                                                     std::placeholders::_1,
                                                                                     std::placeholders::_2,
                                                                                     connection.first))).first->second;
}